

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

shared_ptr<mnf::Manifold> __thiscall RobotManifold::getNewCopy_(RobotManifold *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  RobotManifold *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RobotManifold *in_RSI;
  shared_ptr<mnf::Manifold> sVar2;
  shared_ptr<RobotManifold> copy;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  this_00 = (RobotManifold *)operator_new(0xa0);
  RobotManifold(this_00,in_RSI);
  std::__shared_ptr<RobotManifold,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<RobotManifold,void>
            ((__shared_ptr<RobotManifold,(__gnu_cxx::_Lock_policy)2> *)&local_28,this_00);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)this = local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x8 = _Var1._M_pi;
  local_28 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mnf::Manifold>)
         sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<mnf::Manifold> getNewCopy_() const
  {
    std::shared_ptr<RobotManifold> copy(new RobotManifold(*this));
    return copy;
  }